

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

void __thiscall
mp::internal::NLFileReader<fmt::File>::Open(NLFileReader<fmt::File> *this,CStringRef filename)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  long lVar3;
  ulong uVar4;
  LongLong in_RSI;
  long in_RDI;
  size_t remainder;
  size_t page_size;
  File *in_stack_00000050;
  File *in_stack_ffffffffffffff98;
  File *in_stack_ffffffffffffffa0;
  File *this_00;
  undefined8 in_stack_ffffffffffffffc0;
  File *in_stack_ffffffffffffffc8;
  CStringRef in_stack_ffffffffffffffd0;
  File local_14 [3];
  LongLong local_8;
  
  this_00 = local_14;
  local_8 = in_RSI;
  fmt::File::File(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0,
                  (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  fmt::File::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  fmt::File::~File(this_00);
  fmt::File::size(in_stack_00000050);
  sVar2 = ConvertFileToMmapSize(local_8,in_stack_ffffffffffffffd0);
  *(size_t *)(in_RDI + 8) = sVar2;
  iVar1 = fmt::getpagesize();
  uVar4 = *(ulong *)(in_RDI + 8) % CONCAT44(extraout_var,iVar1);
  if (uVar4 == 0) {
    lVar3 = *(long *)(in_RDI + 8);
  }
  else {
    lVar3 = (*(long *)(in_RDI + 8) + CONCAT44(extraout_var,iVar1)) - uVar4;
  }
  *(long *)(in_RDI + 0x10) = lVar3;
  return;
}

Assistant:

void mp::internal::NLFileReader<File>::Open(fmt::CStringRef filename) {
  file_ = File(filename, fmt::File::RDONLY | fmt::File::BINARY);
  size_ = ConvertFileToMmapSize(file_.size(), filename);
  // Round size up to a multiple of page_size. The remainded of the last
  // partial page is zero-filled both on POSIX and Windows so the resulting
  // memory buffer is zero terminated.
  std::size_t page_size = fmt::getpagesize();
  std::size_t remainder = size_ % page_size;
  rounded_size_ = remainder != 0 ? (size_ + page_size - remainder) : size_;
}